

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O2

rc_size __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  rc_data *prVar4;
  float fVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_000012c4 [12];
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  uVar6 = 0;
  uVar7 = 0;
  for (; begin != end; begin = begin + 1) {
    sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
    piVar3 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    auVar8 = ZEXT816(0) << 0x40;
    auVar9 = ZEXT816(0) << 0x40;
    while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
           local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl) {
      iVar2 = *local_38._M_head_impl;
      piVar1 = local_38._M_head_impl + 1;
      local_38._M_head_impl = local_38._M_head_impl + 2;
      auVar10._0_4_ = (float)piVar3[iVar2];
      auVar10._4_12_ = in_register_000012c4;
      auVar8 = vfmadd231ss_fma(auVar8,auVar10,
                               ZEXT416((uint)(this->pi)._M_t.
                                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                             .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                             [*piVar1]));
      auVar9 = vfmadd231ss_fma(auVar9,auVar10,
                               ZEXT416((uint)(this->P)._M_t.
                                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                             .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                             [iVar2]));
    }
    prVar4 = (this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_false>
             ._M_head_impl;
    prVar4[uVar6].id = (int)uVar6;
    fVar5 = ((this->c->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl[begin->column] - auVar8._0_4_) -
            auVar9._0_4_;
    prVar4[uVar6].value = fVar5;
    iVar2 = piVar3[begin->value];
    prVar4[uVar6].f = iVar2;
    if (iVar2 < 0) {
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar8 = vxorps_avx512vl(ZEXT416((uint)fVar5),auVar8);
      uVar7 = uVar7 + 1;
      prVar4[uVar6].value = auVar8._0_4_;
    }
    uVar6 = uVar6 + 1;
  }
  return (rc_size)(uVar6 & 0xffffffff | (ulong)uVar7 << 0x20);
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A[std::get<0>(ht)->value]);

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A[begin->value];

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }